

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::one_thread::impl::
data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::set_data_sources_name_base
          (data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,string *name_base,void *disp_this_pointer)

{
  string sStack_68;
  prefix_t local_48;
  
  std::__cxx11::string::string((string *)&sStack_68,(string *)name_base);
  reuse::make_disp_prefix(&local_48,"ot",&sStack_68,disp_this_pointer);
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x10) = local_48.m_value._16_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x18) = local_48.m_value._24_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x20) = local_48.m_value._32_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x28) = local_48.m_value._40_8_;
  *(undefined8 *)
   (this->
   super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
   ).m_base_prefix.m_value = local_48.m_value._0_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 8) = local_48.m_value._8_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x10) = local_48.m_value._16_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_base_prefix.m_value + 0x18) = local_48.m_value._24_8_;
  std::__cxx11::string::~string((string *)&sStack_68);
  reuse::make_disp_working_thread_prefix
            (&local_48,
             &(this->
              super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
              ).m_base_prefix,0);
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x10) = local_48.m_value._16_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x18) = local_48.m_value._24_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x20) = local_48.m_value._32_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x28) = local_48.m_value._40_8_;
  *(undefined8 *)
   (this->
   super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
   ).m_work_thread_prefix.m_value = local_48.m_value._0_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 8) = local_48.m_value._8_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x10) = local_48.m_value._16_8_;
  *(undefined8 *)
   ((this->
    super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
    ).m_work_thread_prefix.m_value + 0x18) = local_48.m_value._24_8_;
  return;
}

Assistant:

void
		set_data_sources_name_base(
			const std::string & name_base,
			const void * disp_this_pointer )
			{
				using namespace so_5::disp::reuse;

				this->m_base_prefix = make_disp_prefix(
						"ot", // ot -- one_thread
						name_base,
						disp_this_pointer );

				this->m_work_thread_prefix = make_disp_working_thread_prefix(
						this->m_base_prefix,
						0 );
			}